

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGetTargetPropertyCommand.cxx
# Opt level: O0

bool __thiscall
cmGetTargetPropertyCommand::InitialPass
          (cmGetTargetPropertyCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,cmExecutionStatus *param_2)

{
  cmMakefile *pcVar1;
  MessageType t;
  bool bVar2;
  TargetType tgtType;
  PolicyStatus PVar3;
  size_type sVar4;
  const_reference __lhs;
  cmTarget *this_00;
  const_reference pvVar5;
  string *psVar6;
  ulong uVar7;
  cmMessenger *messenger_00;
  ostream *poVar8;
  char *pcVar9;
  PolicyID id;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b0;
  int local_28c;
  string local_288;
  string local_268;
  MessageType local_244;
  undefined1 local_240 [4];
  MessageType messageType;
  ostringstream e;
  bool issueMessage;
  cmMessenger *messenger;
  cmListFileBacktrace bt;
  char *prop_cstr;
  cmTarget *tgt;
  string local_90 [7];
  bool prop_exists;
  string prop;
  string *targetName;
  string *var;
  allocator<char> local_49;
  string local_48;
  __node_base local_28;
  cmExecutionStatus *param_2_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_local;
  cmGetTargetPropertyCommand *this_local;
  
  local_28._M_nxt = (_Hash_node_base *)param_2;
  param_2_local = (cmExecutionStatus *)args;
  args_local = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)this;
  sVar4 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(args);
  if (sVar4 != 3) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_48,"called with incorrect number of arguments",&local_49);
    cmCommand::SetError(&this->super_cmCommand,&local_48);
    std::__cxx11::string::~string((string *)&local_48);
    std::allocator<char>::~allocator(&local_49);
    this_local._7_1_ = 0;
    goto LAB_0037781b;
  }
  __lhs = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)param_2_local,0);
  prop.field_2._8_8_ =
       std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)param_2_local,1);
  std::__cxx11::string::string(local_90);
  tgt._7_1_ = false;
  this_00 = cmMakefile::FindTargetToUse
                      ((this->super_cmCommand).Makefile,(string *)prop.field_2._8_8_,false);
  if (this_00 == (cmTarget *)0x0) {
    bVar2 = false;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_240);
    local_244 = AUTHOR_WARNING;
    PVar3 = cmMakefile::GetPolicyStatus((this->super_cmCommand).Makefile,CMP0045,false);
    if (PVar3 != OLD) {
      if (PVar3 == WARN) {
        bVar2 = true;
        cmPolicies::GetPolicyWarning_abi_cxx11_(&local_268,(cmPolicies *)0x2d,id);
        poVar8 = std::operator<<((ostream *)local_240,(string *)&local_268);
        std::operator<<(poVar8,"\n");
        std::__cxx11::string::~string((string *)&local_268);
      }
      else if (PVar3 - NEW < 3) {
        bVar2 = true;
        local_244 = FATAL_ERROR;
      }
    }
    if (bVar2) {
      poVar8 = std::operator<<((ostream *)local_240,
                               "get_target_property() called with non-existent target \"");
      poVar8 = std::operator<<(poVar8,(string *)prop.field_2._8_8_);
      std::operator<<(poVar8,"\".");
      t = local_244;
      pcVar1 = (this->super_cmCommand).Makefile;
      std::__cxx11::ostringstream::str();
      cmMakefile::IssueMessage(pcVar1,t,&local_288);
      std::__cxx11::string::~string((string *)&local_288);
      if (local_244 != FATAL_ERROR) goto LAB_003776dd;
      this_local._7_1_ = 0;
      local_28c = 1;
    }
    else {
LAB_003776dd:
      local_28c = 0;
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_240);
    if (local_28c == 0) goto LAB_00377716;
  }
  else {
    pvVar5 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)param_2_local,2);
    bVar2 = std::operator==(pvVar5,"ALIASED_TARGET");
    if (bVar2) {
      tgt._7_1_ = cmMakefile::IsAlias((this->super_cmCommand).Makefile,(string *)prop.field_2._8_8_)
      ;
      if (tgt._7_1_) {
        psVar6 = cmTarget::GetName_abi_cxx11_(this_00);
        std::__cxx11::string::operator=(local_90,(string *)psVar6);
      }
    }
    else {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)param_2_local,2);
      uVar7 = std::__cxx11::string::empty();
      if ((uVar7 & 1) == 0) {
        bt.TopEntry.super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        cmMakefile::GetBacktrace((cmMakefile *)&messenger);
        messenger_00 = cmMakefile::GetMessenger((this->super_cmCommand).Makefile);
        tgtType = cmTarget::GetType(this_00);
        pvVar5 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)param_2_local,2);
        bVar2 = cmTargetPropertyComputer::PassesWhitelist
                          (tgtType,pvVar5,messenger_00,(cmListFileBacktrace *)&messenger);
        if (bVar2) {
          pvVar5 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)param_2_local,2);
          bt.TopEntry.
          super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi =
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               cmTarget::GetComputedProperty
                         (this_00,pvVar5,messenger_00,(cmListFileBacktrace *)&messenger);
          if (bt.TopEntry.
              super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            pvVar5 = std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   *)param_2_local,2);
            bt.TopEntry.
            super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi =
                 (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 cmTarget::GetProperty(this_00,pvVar5);
          }
        }
        tgt._7_1_ = bt.TopEntry.
                    super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        if (tgt._7_1_) {
          std::__cxx11::string::operator=
                    (local_90,(char *)bt.TopEntry.
                                      super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>
                                      ._M_refcount._M_pi);
        }
        cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)&messenger);
      }
    }
LAB_00377716:
    if (tgt._7_1_ == false) {
      pcVar1 = (this->super_cmCommand).Makefile;
      std::operator+(&local_2b0,__lhs,"-NOTFOUND");
      pcVar9 = (char *)std::__cxx11::string::c_str();
      cmMakefile::AddDefinition(pcVar1,__lhs,pcVar9);
      std::__cxx11::string::~string((string *)&local_2b0);
      this_local._7_1_ = 1;
      local_28c = 1;
    }
    else {
      pcVar1 = (this->super_cmCommand).Makefile;
      pcVar9 = (char *)std::__cxx11::string::c_str();
      cmMakefile::AddDefinition(pcVar1,__lhs,pcVar9);
      this_local._7_1_ = 1;
      local_28c = 1;
    }
  }
  std::__cxx11::string::~string(local_90);
LAB_0037781b:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool cmGetTargetPropertyCommand::InitialPass(
  std::vector<std::string> const& args, cmExecutionStatus&)
{
  if (args.size() != 3) {
    this->SetError("called with incorrect number of arguments");
    return false;
  }
  std::string const& var = args[0];
  std::string const& targetName = args[1];
  std::string prop;
  bool prop_exists = false;

  if (cmTarget* tgt = this->Makefile->FindTargetToUse(targetName)) {
    if (args[2] == "ALIASED_TARGET") {
      if (this->Makefile->IsAlias(targetName)) {
        prop = tgt->GetName();
        prop_exists = true;
      }
    } else if (!args[2].empty()) {
      const char* prop_cstr = nullptr;
      cmListFileBacktrace bt = this->Makefile->GetBacktrace();
      cmMessenger* messenger = this->Makefile->GetMessenger();
      if (cmTargetPropertyComputer::PassesWhitelist(tgt->GetType(), args[2],
                                                    messenger, bt)) {
        prop_cstr = tgt->GetComputedProperty(args[2], messenger, bt);
        if (!prop_cstr) {
          prop_cstr = tgt->GetProperty(args[2]);
        }
      }
      if (prop_cstr) {
        prop = prop_cstr;
        prop_exists = true;
      }
    }
  } else {
    bool issueMessage = false;
    std::ostringstream e;
    MessageType messageType = MessageType::AUTHOR_WARNING;
    switch (this->Makefile->GetPolicyStatus(cmPolicies::CMP0045)) {
      case cmPolicies::WARN:
        issueMessage = true;
        e << cmPolicies::GetPolicyWarning(cmPolicies::CMP0045) << "\n";
      case cmPolicies::OLD:
        break;
      case cmPolicies::REQUIRED_IF_USED:
      case cmPolicies::REQUIRED_ALWAYS:
      case cmPolicies::NEW:
        issueMessage = true;
        messageType = MessageType::FATAL_ERROR;
    }
    if (issueMessage) {
      e << "get_target_property() called with non-existent target \""
        << targetName << "\".";
      this->Makefile->IssueMessage(messageType, e.str());
      if (messageType == MessageType::FATAL_ERROR) {
        return false;
      }
    }
  }
  if (prop_exists) {
    this->Makefile->AddDefinition(var, prop.c_str());
    return true;
  }
  this->Makefile->AddDefinition(var, (var + "-NOTFOUND").c_str());
  return true;
}